

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::InitToCellUnionBorder(S2Polygon *this,S2CellUnion *cells)

{
  pointer pSVar1;
  S2Polygon *this_00;
  bool bVar2;
  uint64 uVar3;
  pointer pSVar4;
  double dVar5;
  S2Error error;
  S2Builder builder;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_360;
  S2Polygon *local_358;
  undefined1 local_350 [56];
  undefined1 local_318 [16];
  S2Point *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [11];
  S2Builder local_250;
  
  dVar5 = ldexp(S2::kMinWidth,-0x1e);
  s2builderutil::IdentitySnapFunction::IdentitySnapFunction
            ((IdentitySnapFunction *)local_350,(S1Angle)(dVar5 * 0.5));
  S2Builder::Options::Options((Options *)local_318,(SnapFunction *)local_350);
  S2Builder::S2Builder(&local_250,(Options *)local_318);
  if ((SnapFunction *)local_318._0_8_ != (SnapFunction *)0x0) {
    (**(code **)(*(long *)local_318._0_8_ + 8))();
  }
  local_350._0_8_ = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)local_318,(S2Polygon **)local_350);
  local_360._M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
  super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
       (tuple<S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)
       (tuple<S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)local_318._0_8_;
  local_318._0_8_ = (SnapFunction *)0x0;
  S2Builder::StartLayer
            (&local_250,
             (unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)&local_360);
  if ((_Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)
      local_360._M_t.
      super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
      super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl != (Layer *)0x0) {
    (*(*(_func_int ***)
        local_360._M_t.
        super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
        super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl)[1])();
  }
  local_360._M_t.super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
  super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
       (tuple<S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)
       (_Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>)0x0;
  local_358 = this;
  if ((_Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>)
      local_318._0_8_ != (SnapFunction *)0x0) {
    (**(code **)(*(long *)local_318._0_8_ + 8))();
  }
  pSVar4 = (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar1) {
    do {
      S2Cell::S2Cell((S2Cell *)local_350,(S2CellId)pSVar4->id_);
      S2Loop::S2Loop((S2Loop *)local_318,(S2Cell *)local_350);
      S2Builder::AddLoop(&local_250,(S2Loop *)local_318);
      S2Loop::~S2Loop((S2Loop *)local_318);
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  local_318._0_8_ = local_318._0_8_ & 0xffffffff00000000;
  local_308 = (S2Point *)0x0;
  local_300[0]._M_local_buf[0] = false;
  local_318._8_8_ = local_300;
  bVar2 = S2Builder::Build(&local_250,(S2Error *)local_318);
  this_00 = local_358;
  if (bVar2) {
    if (((int)((ulong)((long)(local_358->loops_).
                             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_358->loops_).
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) &&
       ((cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar3 = S2CellUnion::LeafCellsCovered(cells);
      if (uVar3 != 0x6000000000000000) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_350,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x51b,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_350._8_8_,
                   "Check failed: (uint64{6} << (2 * S2CellId::kMaxLevel)) == (cells.LeafCellsCovered()) "
                   ,0x55);
        goto LAB_0020f063;
      }
      Invert(this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._8_8_ != local_300) {
      operator_delete((void *)local_318._8_8_);
    }
    S2Builder::~S2Builder(&local_250);
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)local_350,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x513,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_350._8_8_,"InitToCellUnionBorder failed: ",0x1e);
  ::operator<<((ostream *)local_350._8_8_,(S2Error *)local_318);
LAB_0020f063:
  abort();
}

Assistant:

void S2Polygon::InitToCellUnionBorder(const S2CellUnion& cells) {
  // We use S2Builder to compute the union.  Due to rounding errors, we can't
  // compute an exact union - when a small cell is adjacent to a larger cell,
  // the shared edges can fail to line up exactly.  Two cell edges cannot come
  // closer then kMinWidth, so if we have S2Builder snap edges within half
  // that distance, then we should always merge shared edges without merging
  // different edges.
  double snap_radius = 0.5 * S2::kMinWidth.GetValue(S2CellId::kMaxLevel);
  S2Builder builder{S2Builder::Options(
      IdentitySnapFunction(S1Angle::Radians(snap_radius)))};
  builder.StartLayer(make_unique<S2PolygonLayer>(this));
  for (S2CellId id : cells) {
    builder.AddLoop(S2Loop{S2Cell{id}});
  }
  S2Error error;
  if (!builder.Build(&error)) {
    S2_LOG(DFATAL) << "InitToCellUnionBorder failed: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  There are only two ways that this can
  // happen: either the cell union is empty, or it consists of all six faces.
  if (num_loops() == 0) {
    if (cells.empty()) return;
    S2_DCHECK_EQ(uint64{6} << (2 * S2CellId::kMaxLevel),
              cells.LeafCellsCovered());
    Invert();
  }
}